

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Action.cpp
# Opt level: O2

void __thiscall BackupRestaurant::act(BackupRestaurant *this,Restaurant *restaurant)

{
  Restaurant *this_00;
  
  (this->super_BaseAction).status = COMPLETED;
  if (backup == (Restaurant *)0x0) {
    this_00 = (Restaurant *)operator_new(0x78);
    Restaurant::Restaurant(this_00,restaurant);
  }
  else {
    (*backup->_vptr_Restaurant[1])();
    backup = (Restaurant *)0x0;
    this_00 = (Restaurant *)operator_new(0x78);
    Restaurant::Restaurant(this_00,restaurant);
  }
  backup = this_00;
  return;
}

Assistant:

void BackupRestaurant::act(Restaurant &restaurant)
{
    complete();
    if(backup!= nullptr)
    {
        delete backup;
        backup= nullptr;
        backup =  new Restaurant(restaurant);
    }
    else
        backup = new Restaurant(restaurant);
}